

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::end_pass(memory_tree *b)

{
  ostream *poVar1;
  
  b->current_pass = b->current_pass + 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"######### Current Pass: ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,", with number of memories strored so far: ",0x2a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void end_pass(memory_tree& b){
        b.current_pass ++;
        cout<<"######### Current Pass: "<<b.current_pass<<", with number of memories strored so far: "<<b.examples.size()<<endl;
    }